

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O1

int coda_ascii_cursor_read_bits
              (coda_cursor_conflict *cursor,uint8_t *dst,int64_t bit_offset,int64_t bit_length)

{
  int iVar1;
  ulong uVar2;
  char *message;
  
  if ((bit_length & 7U) == 0) {
    uVar2 = bit_offset + cursor->stack[(long)cursor->n + -1].bit_offset;
    if ((uVar2 & 7) == 0) {
      iVar1 = read_bytes(cursor->product,(long)uVar2 >> 3,bit_length >> 3,dst);
      return iVar1;
    }
    message = "product error detected (ascii text does not start at byte boundary)";
    iVar1 = -300;
  }
  else {
    message = "cannot read ascii data using a bitsize that is not a multiple of 8";
    iVar1 = -100;
  }
  coda_set_error(iVar1,message);
  return -1;
}

Assistant:

int coda_ascii_cursor_read_bits(const coda_cursor *cursor, uint8_t *dst, int64_t bit_offset, int64_t bit_length)
{
    if (bit_length & 0x7)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT,
                       "cannot read ascii data using a bitsize that is not a multiple of 8");
        return -1;
    }
    if ((cursor->stack[cursor->n - 1].bit_offset + bit_offset) & 0x7)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii text does not start at byte boundary)");
        return -1;
    }
    return read_bytes(cursor->product, (cursor->stack[cursor->n - 1].bit_offset + bit_offset) >> 3, bit_length >> 3,
                      dst);
}